

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O1

TestStatus *
vkt::pipeline::anon_unknown_0::testRenderToMipMaps
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict *caseDef)

{
  VkBufferCreateFlags VVar1;
  int *piVar2;
  VkDevice *ppVVar3;
  VkSharingMode VVar4;
  VkSharingMode VVar5;
  VkFormat VVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var7;
  undefined8 uVar8;
  TestLog *log;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  undefined8 uVar9;
  undefined8 uVar10;
  Handle<(vk::HandleType)17> obj;
  undefined8 uVar11;
  undefined8 uVar12;
  void *pvVar13;
  undefined8 uVar14;
  Handle<(vk::HandleType)9> image;
  Handle<(vk::HandleType)9> image_00;
  VkPipelineLayout pipelineLayout;
  VkShaderModule fragmentModule;
  VkShaderModule vertexModule;
  bool bVar15;
  int i;
  deUint32 queueFamilyIndex;
  VkSharingMode subpassCount;
  int iVar16;
  uint uVar17;
  uint uVar18;
  VkResult VVar19;
  deUint32 queueFamilyIndex_00;
  ChannelOrder CVar20;
  DeviceInterface *vk;
  InstanceInterface *vk_00;
  VkDevice device;
  VkPhysicalDevice physicalDevice;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat TVar21;
  ulong uVar22;
  pointer puVar23;
  const_iterator cVar24;
  DeviceInterface *vk_01;
  VkDevice device_00;
  VkQueue queue_00;
  undefined8 *puVar25;
  long *plVar26;
  NotSupportedError *this;
  VkPrimitiveTopology numLayers;
  void *pvVar27;
  size_type *psVar28;
  byte bVar29;
  VkImageViewType viewType;
  VkPrimitiveTopology VVar30;
  pointer pVVar31;
  VkDeviceSize VVar32;
  VkPipeline basePipeline;
  long lVar33;
  ulong uVar34;
  VkFormatProperties VVar35;
  undefined1 in_stack_fffffffffffffa58;
  uint local_5a4;
  long local_590;
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  VkAllocationCallbacks *pVStack_520;
  long *local_508;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mipLevelStorageSizes;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> mipLevelSizes;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  string comparisonName;
  value_type local_448;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> regions;
  VkAllocationCallbacks *pVStack_420;
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  VkBufferCreateInfo bufferCreateInfo;
  deUint64 local_368;
  int local_360;
  undefined4 local_35c;
  uint local_358;
  undefined4 local_354;
  VkSharingMode local_350;
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  Move<vk::Handle<(vk::HandleType)9>_> colorImage;
  Move<vk::Handle<(vk::HandleType)9>_> depthStencilImage;
  undefined8 local_1e8;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> clearValues;
  VkImageSubresourceRange res_1;
  VkImageSubresourceRange res;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_130;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  depthStencilAttachments;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  deUint64 local_a0;
  VkPipelineLayout local_98;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_90;
  VkShaderModule local_78;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_70;
  VkShaderModule local_58;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_50;
  
  checkImageViewTypeRequirements(context,caseDef->viewType);
  vk = Context::getDeviceInterface(context);
  vk_00 = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  physicalDevice = Context::getPhysicalDevice(context);
  queue = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  local_448.m_data[0] = (caseDef->imageSizeHint).m_data[0];
  local_448.m_data[1] = (caseDef->imageSizeHint).m_data[1];
  uVar10 = *(undefined8 *)(caseDef->imageSizeHint).m_data;
  VVar4 = (caseDef->imageSizeHint).m_data[2];
  VVar5 = (caseDef->imageSizeHint).m_data[3];
  subpassCount = VVar5;
  if ((int)VVar5 < (int)VVar4) {
    subpassCount = VVar4;
  }
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448.m_data[2] = VVar4;
  local_448.m_data[3] = VVar5;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
            (&mipLevelSizes,&local_448);
  while (((local_448.m_data[0] != 1 || (local_448.m_data[1] != 1)) ||
         (local_448.m_data[2] != VK_SHARING_MODE_CONCURRENT))) {
    local_448.m_data[0] = local_448.m_data[0] >> 1;
    if (local_448.m_data[0] < 2) {
      local_448.m_data[0] = 1;
    }
    local_448.m_data[1] = local_448.m_data[1] >> 1;
    if (local_448.m_data[1] < 2) {
      local_448.m_data[1] = 1;
    }
    local_448.m_data[2] = local_448.m_data[2] >> 1;
    if (local_448.m_data[2] < 2) {
      local_448.m_data[2] = VK_SHARING_MODE_CONCURRENT;
    }
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
              (&mipLevelSizes,&local_448);
  }
  TVar21 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar16 = tcu::getPixelSize(TVar21);
  mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar31 = mipLevelSizes.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      bufferCreateInfo._0_8_ =
           (long)pVVar31->m_data[3] *
           (long)pVVar31->m_data[2] * (long)pVVar31->m_data[1] *
           (long)pVVar31->m_data[0] * (long)iVar16 + 0xfU & 0xfffffffffffffff0;
      if (mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&mipLevelStorageSizes,
                   (iterator)
                   mipLevelStorageSizes.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(unsigned_long *)&bufferCreateInfo);
      }
      else {
        *mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish = bufferCreateInfo._0_8_;
        mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pVVar31 = pVVar31 + 1;
    } while (pVVar31 !=
             mipLevelSizes.
             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  uVar22 = (long)mipLevelSizes.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)mipLevelSizes.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  VVar6 = caseDef->depthStencilFormat;
  if ((VVar6 != VK_FORMAT_UNDEFINED) &&
     (VVar35 = ::vk::getPhysicalDeviceFormatProperties(vk_00,physicalDevice,VVar6),
     (VVar35._0_8_ >> 0x29 & 1) == 0)) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"Unsupported depth/stencil format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
               ,0x4ee);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  VVar32 = 0;
  for (puVar23 = mipLevelStorageSizes.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puVar23 !=
      mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish; puVar23 = puVar23 + 1) {
    VVar32 = VVar32 + *puVar23;
  }
  makeBufferCreateInfo(&bufferCreateInfo,VVar32,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&renderPass,vk,device,&bufferCreateInfo
                     ,(VkAllocationCallbacks *)0x0);
  obj = renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object;
  DStack_130.m_deviceIface =
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  DStack_130.m_device =
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  DStack_130.m_allocator =
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,
             (VkBuffer)
             renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  uVar11 = bufferCreateInfo._0_8_;
  memset(*(void **)(bufferCreateInfo._0_8_ + 0x18),0,VVar32);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar11 + 8),*(VkDeviceSize *)(uVar11 + 0x10),
             0xffffffffffffffff);
  p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  ppVVar3 = &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       (deUint64)ppVVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&renderPass,"vert","");
  cVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var7,(key_type *)&renderPass);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar24._M_node + 2),0);
  DStack_50.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_58.m_internal = bufferCreateInfo._0_8_;
  DStack_50.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if ((VkDevice *)renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
      != ppVVar3) {
    operator_delete((void *)renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                            m_internal,
                    (ulong)(renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter
                            .m_device + 1));
  }
  p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       (deUint64)ppVVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&renderPass,"frag","");
  cVar24 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var7,(key_type *)&renderPass);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar24._M_node + 2),0);
  DStack_70.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
  DStack_70.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_78.m_internal = bufferCreateInfo._0_8_;
  DStack_70.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if ((VkDevice *)renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
      != ppVVar3) {
    operator_delete((void *)renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                            m_internal,
                    (ulong)(renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter
                            .m_device + 1));
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,vk,device);
  DStack_90.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
  DStack_90.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_98.m_internal = bufferCreateInfo._0_8_;
  DStack_90.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  uVar34 = (ulong)caseDef->viewType;
  bufferCreateInfo.flags = (uint)(uVar34 == 2) * 0x20;
  VVar1 = bufferCreateInfo.flags + 0x10;
  if (uVar34 == 6) {
    bufferCreateInfo.flags = VVar1;
  }
  if (uVar34 == 3) {
    bufferCreateInfo.flags = VVar1;
  }
  bufferCreateInfo._20_4_ = 3;
  if (uVar34 < 7) {
    bufferCreateInfo._20_4_ = *(undefined4 *)(&DAT_00ae767c + uVar34 * 4);
  }
  bufferCreateInfo.size._0_4_ = caseDef->colorFormat;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  uVar17 = (uint)(uVar22 >> 4);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  bufferCreateInfo.sharingMode = VVar4;
  bufferCreateInfo.queueFamilyIndexCount = uVar17;
  bufferCreateInfo._44_4_ = VVar5;
  bufferCreateInfo._28_8_ = uVar10;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&renderPass,vk,device,
                    (VkImageCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  bufferCreateInfo._16_8_ =
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  bufferCreateInfo.size._0_4_ =
       (VkFormat)
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  bufferCreateInfo.size._4_4_ =
       (VkSharingMode)
       ((ulong)renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
       >> 0x20);
  bufferCreateInfo._0_8_ =
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  bufferCreateInfo.pNext =
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  if (renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
               &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkImage)renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                        m_internal);
  }
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
            device,allocator,
            (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                     m_internal,(MemoryRequirement)0x0);
  uVar12 = bufferCreateInfo._0_8_;
  if (VVar6 == VK_FORMAT_UNDEFINED) {
    local_508 = (long *)0x0;
  }
  else {
    bufferCreateInfo.size._0_4_ = caseDef->depthStencilFormat;
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo.flags = 0;
    bufferCreateInfo._20_4_ = 1;
    bufferCreateInfo.sharingMode = VK_SHARING_MODE_CONCURRENT;
    bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
    bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
    bufferCreateInfo.queueFamilyIndexCount = uVar17;
    bufferCreateInfo._44_4_ = subpassCount;
    bufferCreateInfo._28_8_ = uVar10;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&renderPass,vk,device,
                      (VkImageCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
    bufferCreateInfo._16_8_ =
         renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
    bufferCreateInfo.size._0_4_ =
         (VkFormat)
         renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
    bufferCreateInfo.size._4_4_ =
         (VkSharingMode)
         ((ulong)renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                 m_allocator >> 0x20);
    bufferCreateInfo._0_8_ =
         renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
    bufferCreateInfo.pNext =
         renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal !=
        0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                          object.m_internal);
    }
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)bufferCreateInfo._16_8_;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
         bufferCreateInfo._0_8_;
    depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)bufferCreateInfo.pNext;
    if (renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
                 &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                 (VkImage)renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                          m_internal);
    }
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
              device,allocator,
              (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object
                       .m_internal,(MemoryRequirement)0x0);
    local_508 = (long *)bufferCreateInfo._0_8_;
  }
  genFullQuadVertices(&vertices,subpassCount);
  VVar32 = (long)vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo(&bufferCreateInfo,VVar32,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&renderPass,vk,device,&bufferCreateInfo
                     ,(VkAllocationCallbacks *)0x0);
  bufferCreateInfo._16_8_ =
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  bufferCreateInfo.size._0_4_ =
       (VkFormat)
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  bufferCreateInfo.size._4_4_ =
       (VkSharingMode)
       ((ulong)renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
       >> 0x20);
  bufferCreateInfo._0_8_ =
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  bufferCreateInfo.pNext =
       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  if (renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
               &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkBuffer)
               renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,
             (VkBuffer)
             vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  uVar10 = bufferCreateInfo._0_8_;
  memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start,VVar32);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar10 + 8),*(VkDeviceSize *)(uVar10 + 0x10),
             VVar32);
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,2,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,
                    (VkCommandPool)bufferCreateInfo._0_8_);
  pVStack_520 = (VkAllocationCallbacks *)
                CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferCreateInfo._16_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)bufferCreateInfo._0_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)bufferCreateInfo.pNext;
  beginCommandBuffer(vk,(VkCommandBuffer)bufferCreateInfo._0_8_);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0x100;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 2;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount =
       (deUint32)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  bufferCreateInfo._44_4_ =
       SUB84(colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal >>
             0x20,0);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  local_368 = depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
              m_internal;
  local_360 = 0;
  if (caseDef->depthStencilFormat != VK_FORMAT_UNDEFINED) {
    TVar21 = ::vk::mapVkFormat(caseDef->depthStencilFormat);
    uVar18 = TVar21.order - D;
    local_360 = 1;
    if (uVar18 < 3) {
      local_360 = uVar18 * 2 + 2;
    }
  }
  local_35c = 0;
  local_354 = 0;
  local_358 = uVar17;
  local_350 = subpassCount;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_start,1,0x80,0,0,0,0,0,
             2 - (uint)(VVar6 == VK_FORMAT_UNDEFINED),(int)&bufferCreateInfo);
  VVar19 = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,vertices.
                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  ::vk::checkResult(VVar19,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                    ,0x557);
  submitCommandsAndWait
            (vk,device,queue,
             (VkCommandBuffer)
             vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    bufferCreateInfo._0_8_ =
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (**(code **)(*(long *)((vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->position).m_data + 0x240))
              (vertices.
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               vertices.
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,pVStack_520,1);
  }
  if (renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
               &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkCommandPool)
               renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  if (0 < (int)uVar17) {
    uVar22 = 0;
    do {
      vertexModule.m_internal = local_58.m_internal;
      fragmentModule.m_internal = local_78.m_internal;
      pipelineLayout.m_internal = local_98.m_internal;
      image_00.m_internal =
           depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
      image.m_internal =
           colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
      pVVar31 = mipLevelSizes.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      numLayers = mipLevelSizes.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar22].m_data[3];
      if (mipLevelSizes.
          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22].m_data[3] <
          mipLevelSizes.
          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22].m_data[2]) {
        numLayers = mipLevelSizes.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar22].m_data[2];
      }
      local_a0 = vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      ;
      vk_01 = Context::getDeviceInterface(context);
      device_00 = Context::getDevice(context);
      queue_00 = Context::getUniversalQueue(context);
      queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex(context);
      if (caseDef->depthStencilFormat == VK_FORMAT_UNDEFINED) {
        bVar15 = false;
        local_5a4 = 0;
      }
      else {
        TVar21 = ::vk::mapVkFormat(caseDef->depthStencilFormat);
        bVar15 = true;
        CVar20 = TVar21.order;
        if (CVar20 == DS) {
          local_5a4 = 6;
        }
        else if (CVar20 == S) {
          local_5a4 = 4;
          bVar15 = true;
        }
        else {
          if (CVar20 == D) {
            local_5a4 = 2;
          }
          else {
            local_5a4 = 1;
          }
          bVar15 = false;
        }
      }
      makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                     &((value_type *)&bufferCreateInfo)->depthStencil,vk_01,device_00,
                     caseDef->colorFormat,caseDef->depthStencilFormat,numLayers,
                     VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                     VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
      pVVar31 = pVVar31 + uVar22;
      renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
      renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           (VkDevice)bufferCreateInfo._16_8_;
      renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
           bufferCreateInfo._0_8_;
      renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)bufferCreateInfo.pNext;
      pipelines.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pipelines.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pipelines.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      colorAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      colorAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colorAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      depthStencilAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      depthStencilAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      depthStencilAttachments.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (0 < (int)numLayers) {
        VVar30 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
        basePipeline.m_internal = 0;
        do {
          viewType = VK_IMAGE_VIEW_TYPE_LAST;
          if ((ulong)caseDef->viewType < 7) {
            viewType = *(VkImageViewType *)(&DAT_00ae7698 + (ulong)caseDef->viewType * 4);
          }
          subresourceRange.baseMipLevel = (int)uVar22;
          subresourceRange.aspectMask = 1;
          subresourceRange.levelCount = 1;
          subresourceRange.baseArrayLayer = VVar30;
          subresourceRange.layerCount = 1;
          makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&vertices,vk_01,device_00,
                        (VkImage)image.m_internal,viewType,caseDef->colorFormat,subresourceRange);
          puVar25 = (undefined8 *)operator_new(0x20);
          puVar25[2] = vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar25[3] = pVStack_520;
          *puVar25 = vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          puVar25[1] = vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bufferCreateInfo.pNext = (void *)0x0;
          bufferCreateInfo._0_8_ = puVar25;
          bufferCreateInfo.pNext = operator_new(0x20);
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
          *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d1de90;
          *(undefined8 **)((long)bufferCreateInfo.pNext + 0x10) = puVar25;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                      *)&colorAttachments,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                     &((value_type *)&bufferCreateInfo)->depthStencil);
          if (bufferCreateInfo.pNext != (void *)0x0) {
            LOCK();
            piVar2 = (int *)((long)bufferCreateInfo.pNext + 8);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
              bufferCreateInfo._4_4_ = 0;
              (**(code **)(*bufferCreateInfo.pNext + 0x10))();
            }
            LOCK();
            piVar2 = (int *)((long)bufferCreateInfo.pNext + 0xc);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (bufferCreateInfo.pNext != (void *)0x0) {
                (**(code **)(*bufferCreateInfo.pNext + 8))();
              }
              bufferCreateInfo.pNext = (void *)0x0;
            }
          }
          if (vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                       &vertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                       (VkImageView)
                       vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pVStack_520 = (VkAllocationCallbacks *)0x0;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          if (attachmentHandles.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              attachmentHandles.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>::
            _M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                      ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                        *)&attachmentHandles,
                       (iterator)
                       attachmentHandles.
                       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (Handle<(vk::HandleType)13> *)
                       colorAttachments.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
          }
          else {
            (attachmentHandles.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
                 ((colorAttachments.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
                 super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
            attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 attachmentHandles.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
               *(deUint64 *)pVVar31->m_data;
          makeGraphicsPipeline
                    ((Move<vk::Handle<(vk::HandleType)18>_> *)&regions,vk_01,device_00,basePipeline,
                     pipelineLayout,
                     (VkRenderPass)
                     renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                     m_internal,vertexModule,fragmentModule,(IVec2 *)&framebuffer,VVar30,
                     (local_5a4 & 2) >> 1,bVar15,(bool)in_stack_fffffffffffffa58);
          puVar25 = (undefined8 *)operator_new(0x20);
          puVar25[2] = regions.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar25[3] = pVStack_420;
          *puVar25 = regions.
                     super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          puVar25[1] = regions.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bufferCreateInfo.pNext = (void *)0x0;
          bufferCreateInfo._0_8_ = puVar25;
          bufferCreateInfo.pNext = operator_new(0x20);
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
          *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d1e0d0;
          *(undefined8 **)((long)bufferCreateInfo.pNext + 0x10) = puVar25;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                      *)&pipelines,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                     &((value_type *)&bufferCreateInfo)->depthStencil);
          if (bufferCreateInfo.pNext != (void *)0x0) {
            LOCK();
            piVar2 = (int *)((long)bufferCreateInfo.pNext + 8);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
              bufferCreateInfo._4_4_ = 0;
              (**(code **)(*bufferCreateInfo.pNext + 0x10))();
            }
            LOCK();
            piVar2 = (int *)((long)bufferCreateInfo.pNext + 0xc);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (bufferCreateInfo.pNext != (void *)0x0) {
                (**(code **)(*bufferCreateInfo.pNext + 8))();
              }
              bufferCreateInfo.pNext = (void *)0x0;
            }
          }
          if (regions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)18>_> *)
                       &regions.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                       (VkPipeline)
                       regions.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pVStack_420 = (VkAllocationCallbacks *)0x0;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          basePipeline.m_internal =
               ((pipelines.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr->
               super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
          VVar30 = VVar30 + VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
        } while (numLayers != VVar30);
      }
      bVar29 = bVar15 | (byte)((local_5a4 & 2) >> 1);
      if (bVar29 == 1 && 0 < (int)numLayers) {
        VVar30 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
        do {
          subresourceRange_00.baseMipLevel = (int)uVar22;
          subresourceRange_00.aspectMask = local_5a4;
          subresourceRange_00.levelCount = 1;
          subresourceRange_00.baseArrayLayer = VVar30;
          subresourceRange_00.layerCount = 1;
          makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&comparisonName,vk_01,device_00,
                        (VkImage)image_00.m_internal,VK_IMAGE_VIEW_TYPE_2D,
                        caseDef->depthStencilFormat,subresourceRange_00);
          puVar25 = (undefined8 *)operator_new(0x20);
          puVar25[2] = comparisonName.field_2._M_allocated_capacity;
          puVar25[3] = comparisonName.field_2._8_8_;
          *puVar25 = comparisonName._M_dataplus._M_p;
          puVar25[1] = comparisonName._M_string_length;
          comparisonName._M_dataplus._M_p = (pointer)0x0;
          comparisonName._M_string_length = 0;
          comparisonName.field_2._M_allocated_capacity = 0;
          comparisonName.field_2._8_8_ = 0;
          bufferCreateInfo.pNext = (void *)0x0;
          bufferCreateInfo._0_8_ = puVar25;
          bufferCreateInfo.pNext = operator_new(0x20);
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
          *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d1de90;
          *(undefined8 **)((long)bufferCreateInfo.pNext + 0x10) = puVar25;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
          *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                      *)&depthStencilAttachments,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                     &((value_type *)&bufferCreateInfo)->depthStencil);
          if (bufferCreateInfo.pNext != (void *)0x0) {
            LOCK();
            piVar2 = (int *)((long)bufferCreateInfo.pNext + 8);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
              bufferCreateInfo._4_4_ = 0;
              (**(code **)(*bufferCreateInfo.pNext + 0x10))();
            }
            LOCK();
            piVar2 = (int *)((long)bufferCreateInfo.pNext + 0xc);
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (bufferCreateInfo.pNext != (void *)0x0) {
                (**(code **)(*bufferCreateInfo.pNext + 8))();
              }
              bufferCreateInfo.pNext = (void *)0x0;
            }
          }
          if (comparisonName._M_dataplus._M_p != (pointer)0x0) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                      ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&comparisonName._M_string_length,
                       (VkImageView)comparisonName._M_dataplus._M_p);
          }
          comparisonName.field_2._M_allocated_capacity = 0;
          comparisonName.field_2._8_8_ = 0;
          comparisonName._M_dataplus._M_p = (pointer)0x0;
          comparisonName._M_string_length = 0;
          if (attachmentHandles.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              attachmentHandles.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>::
            _M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                      ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                        *)&attachmentHandles,
                       (iterator)
                       attachmentHandles.
                       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (Handle<(vk::HandleType)13> *)
                       depthStencilAttachments.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
          }
          else {
            (attachmentHandles.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
                 ((depthStencilAttachments.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
                 super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
            attachmentHandles.
            super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 attachmentHandles.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          VVar30 = VVar30 + VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
        } while (numLayers != VVar30);
      }
      makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)
                      &((value_type *)&bufferCreateInfo)->depthStencil,vk_01,device_00,
                      (VkRenderPass)
                      renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                      m_internal,
                      (deUint32)
                      ((ulong)((long)attachmentHandles.
                                     super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)attachmentHandles.
                                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3),
                      attachmentHandles.
                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,pVVar31->m_data[0],
                      pVVar31->m_data[1],1);
      framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
      framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
           (VkDevice)bufferCreateInfo._16_8_;
      framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
           bufferCreateInfo._0_8_;
      framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)bufferCreateInfo.pNext;
      ::vk::createCommandPool
                ((Move<vk::Handle<(vk::HandleType)24>_> *)
                 &((value_type *)&bufferCreateInfo)->depthStencil,vk_01,device_00,2,
                 queueFamilyIndex_00,(VkAllocationCallbacks *)0x0);
      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
           (VkDevice)bufferCreateInfo._16_8_;
      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
           bufferCreateInfo._0_8_;
      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)bufferCreateInfo.pNext;
      makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)
                        &((value_type *)&bufferCreateInfo)->depthStencil,vk_01,device_00,
                        (VkCommandPool)bufferCreateInfo._0_8_);
      uVar14 = bufferCreateInfo._16_8_;
      pvVar13 = bufferCreateInfo.pNext;
      uVar8 = bufferCreateInfo._0_8_;
      uVar9 = CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
      beginCommandBuffer(vk_01,(VkCommandBuffer)bufferCreateInfo._0_8_);
      VVar6 = caseDef->colorFormat;
      bVar15 = ::vk::isUintFormat(VVar6);
      pvVar27 = (void *)0x7d0000007d;
      if (!bVar15) {
        bVar15 = ::vk::isIntFormat(VVar6);
        pvVar27 = (void *)0x3f8000003f800000;
        if (bVar15) {
          pvVar27 = (void *)0x7d0000007d;
        }
      }
      bufferCreateInfo._0_8_ = pvVar27;
      bufferCreateInfo.pNext = pvVar27;
      std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
                (&clearValues,(long)(int)numLayers,(value_type *)&bufferCreateInfo,
                 (allocator_type *)&local_1e8);
      if (bVar29 != 0) {
        bufferCreateInfo.sType = 0x3f800000;
        bufferCreateInfo._4_4_ = 0x2a;
        std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::_M_fill_insert
                  (&clearValues,
                   (iterator)
                   clearValues.
                   super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long)(int)numLayers,
                   (value_type *)&bufferCreateInfo);
      }
      bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo._16_8_ =
           renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
      bufferCreateInfo.size._0_4_ =
           (VkFormat)
           framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
      bufferCreateInfo.size._4_4_ =
           (VkSharingMode)
           (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal >>
           0x20);
      bufferCreateInfo.usage = 0;
      bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      bufferCreateInfo.queueFamilyIndexCount = (deUint32)*(undefined8 *)pVVar31->m_data;
      bufferCreateInfo._44_4_ = SUB84((ulong)*(undefined8 *)pVVar31->m_data >> 0x20,0);
      bufferCreateInfo.pQueueFamilyIndices._0_4_ =
           (undefined4)
           ((ulong)((long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)clearValues.
                         super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 4);
      local_1e8 = 0;
      (*vk_01->_vptr_DeviceInterface[0x74])(vk_01,uVar8,(value_type *)&bufferCreateInfo,0);
      (*vk_01->_vptr_DeviceInterface[0x58])(vk_01,uVar8,0,1,&local_a0);
      if (clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(clearValues.
                        super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)clearValues.
                              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)clearValues.
                              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (numLayers != VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
        uVar34 = 0;
        do {
          if (uVar34 != 0) {
            (*vk_01->_vptr_DeviceInterface[0x75])(vk_01,uVar8,0);
          }
          (*vk_01->_vptr_DeviceInterface[0x4c])
                    (vk_01,uVar8,0,
                     **(undefined8 **)
                       ((long)&(pipelines.
                                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar34 * 4));
          (*vk_01->_vptr_DeviceInterface[0x59])(vk_01,uVar8,4,1,uVar34 & 0xffffffff);
          uVar34 = uVar34 + 4;
        } while ((ulong)numLayers << 2 != uVar34);
      }
      (*vk_01->_vptr_DeviceInterface[0x76])(vk_01,uVar8);
      VVar19 = (*vk_01->_vptr_DeviceInterface[0x4a])(vk_01,uVar8);
      ::vk::checkResult(VVar19,"vk.endCommandBuffer(*cmdBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                        ,0x4d4);
      submitCommandsAndWait(vk_01,device_00,queue_00,(VkCommandBuffer)uVar8);
      if (uVar8 != 0) {
        bufferCreateInfo._0_8_ = uVar8;
        (**(code **)(*pvVar13 + 0x240))(pvVar13,uVar14,uVar9,1,(value_type *)&bufferCreateInfo);
      }
      if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                   (VkCommandPool)
                   cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
      }
      if (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0)
      {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
                   (VkFramebuffer)
                   framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
                   m_internal);
      }
      if (attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(attachmentHandles.
                        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)attachmentHandles.
                              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)attachmentHandles.
                              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::~vector(&depthStencilAttachments);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::~vector(&colorAttachments);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ::~vector(&pipelines);
      if (renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                  (&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                   (VkRenderPass)
                   renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                   m_internal);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != (uVar17 & 0x7fffffff));
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,2,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,
                    (VkCommandPool)bufferCreateInfo._0_8_);
  uVar9 = CONCAT44(bufferCreateInfo.size._4_4_,(VkFormat)bufferCreateInfo.size);
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferCreateInfo._16_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)bufferCreateInfo._0_8_;
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)bufferCreateInfo.pNext;
  beginCommandBuffer(vk,(VkCommandBuffer)bufferCreateInfo._0_8_);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x100;
  bufferCreateInfo._20_4_ = 0x800;
  bufferCreateInfo.size._0_4_ = 2;
  bufferCreateInfo.size._4_4_ = 6;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount =
       (deUint32)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  bufferCreateInfo._44_4_ =
       SUB84(colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal >>
             0x20,0);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_start,0x400,0x1000,0,0,0,0,0,1,
             (int)&bufferCreateInfo);
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 1;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  bufferCreateInfo.size._4_4_ = VVar5;
  if (0 < (int)uVar17) {
    lVar33 = 8;
    uVar22 = 0;
    VVar32 = 0;
    do {
      bufferCreateInfo._20_4_ = (int)uVar22;
      bufferCreateInfo.pQueueFamilyIndices._4_4_ =
           *(undefined4 *)
            ((long)(mipLevelSizes.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start)->m_data + lVar33);
      uVar8 = *(undefined8 *)
               ((long)(mipLevelSizes.
                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar33 + -8);
      bufferCreateInfo._44_4_ = SUB84(uVar8,0);
      bufferCreateInfo.pQueueFamilyIndices._0_4_ = (undefined4)((ulong)uVar8 >> 0x20);
      bufferCreateInfo._0_8_ = VVar32;
      if (regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>>::
        _M_realloc_insert<vk::VkBufferImageCopy_const&>
                  ((vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>> *)&regions,
                   (iterator)
                   regions.
                   super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(VkBufferImageCopy *)&bufferCreateInfo
                  );
      }
      else {
        ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish)->imageExtent).height =
             bufferCreateInfo.pQueueFamilyIndices._0_4_;
        ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish)->imageExtent).depth =
             bufferCreateInfo.pQueueFamilyIndices._4_4_;
        ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish)->imageOffset).x = bufferCreateInfo.usage;
        ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish)->imageOffset).y = bufferCreateInfo.sharingMode;
        *(ulong *)&((regions.
                     super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->imageOffset).z =
             CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount);
        ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).aspectMask =
             bufferCreateInfo.flags;
        ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).mipLevel = (int)uVar22;
        ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).baseArrayLayer =
             (VkFormat)bufferCreateInfo.size;
        ((regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
          _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).layerCount =
             bufferCreateInfo.size._4_4_;
        (regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
         _M_impl.super__Vector_impl_data._M_finish)->bufferOffset = VVar32;
        *(void **)&(regions.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->bufferRowLength =
             bufferCreateInfo.pNext;
        regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             regions.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      VVar32 = VVar32 + mipLevelStorageSizes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar22];
      uVar22 = uVar22 + 1;
      lVar33 = lVar33 + 0x10;
    } while ((uVar17 & 0x7fffffff) != uVar22);
  }
  (*vk->_vptr_DeviceInterface[99])
            (vk,vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_start,
             colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,
             obj.m_internal,
             (ulong)(uint)((int)((ulong)((long)regions.
                                               super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)regions.
                                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x49249249),
             (int)regions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_start);
  if (regions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(regions.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)regions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)regions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x1000;
  bufferCreateInfo._20_4_ = 0x2000;
  bufferCreateInfo.size._0_4_ = 0xffffffff;
  bufferCreateInfo.size._4_4_ = 0xffffffff;
  bufferCreateInfo.usage = (VkBufferUsageFlags)obj.m_internal;
  bufferCreateInfo.sharingMode = (VkSharingMode)(obj.m_internal >> 0x20);
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0xffffffff;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0xffffffff;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_start,0x1000,0x4000,0,0,0,1,
             (int)&bufferCreateInfo,0,0);
  VVar19 = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,vertices.
                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  ::vk::checkResult(VVar19,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                    ,0x5b4);
  submitCommandsAndWait
            (vk,device,queue,
             (VkCommandBuffer)
             vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    bufferCreateInfo._0_8_ =
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (**(code **)(*(long *)((vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->position).m_data + 0x240))
              (vertices.
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               vertices.
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar9,1);
  }
  if (renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
               &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkCommandPool)
               renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar11 + 8),*(VkDeviceSize *)(uVar11 + 0x10),
             0xffffffffffffffff);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)::vk::mapVkFormat(caseDef->colorFormat);
  if ((int)uVar17 < 1) {
    bVar29 = 1;
  }
  else {
    bVar29 = 1;
    uVar22 = 0;
    local_590 = 0;
    do {
      pVVar31 = mipLevelSizes.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar16 = mipLevelSizes.
               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar22].m_data[3];
      if (mipLevelSizes.
          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22].m_data[3] <
          mipLevelSizes.
          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22].m_data[2]) {
        iVar16 = mipLevelSizes.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar22].m_data[2];
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&renderPass,(TextureFormat *)&cmdPool,
                 mipLevelSizes.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar22].m_data[0],
                 mipLevelSizes.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar22].m_data[1],iVar16,
                 (void *)(*(long *)(uVar11 + 0x18) + local_590));
      pVVar31 = pVVar31 + uVar22;
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&vertices,(TextureFormat *)&cmdPool,pVVar31->m_data[0],
                 pVVar31->m_data[1],iVar16);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&regions,(TextureLevel *)&vertices);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&bufferCreateInfo);
      std::ostream::operator<<(&bufferCreateInfo,(int)uVar22);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bufferCreateInfo);
      std::ios_base::~ios_base((ios_base *)&local_368);
      plVar26 = (long *)std::__cxx11::string::replace((ulong)&framebuffer,0,(char *)0x0,0xae78a8);
      psVar28 = (size_type *)(plVar26 + 2);
      if ((size_type *)*plVar26 == psVar28) {
        comparisonName.field_2._M_allocated_capacity = *psVar28;
        comparisonName.field_2._8_8_ = plVar26[3];
        comparisonName._M_dataplus._M_p = (pointer)&comparisonName.field_2;
      }
      else {
        comparisonName.field_2._M_allocated_capacity = *psVar28;
        comparisonName._M_dataplus._M_p = (pointer)*plVar26;
      }
      comparisonName._M_string_length = plVar26[1];
      *plVar26 = (long)psVar28;
      plVar26[1] = 0;
      *(undefined1 *)(plVar26 + 2) = 0;
      if ((VkDevice *)
          framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal !=
          &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device) {
        operator_delete((void *)framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.
                                object.m_internal,
                        (ulong)(framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.
                                deleter.m_device + 1));
      }
      bufferCreateInfo.sType = pVVar31->m_data[0];
      bufferCreateInfo._4_4_ = pVVar31->m_data[1];
      generateExpectedImage((PixelBufferAccess *)&regions,(IVec2 *)&bufferCreateInfo,0);
      bVar15 = ::vk::isFloatFormat(caseDef->colorFormat);
      log = context->m_testCtx->m_log;
      if (bVar15) {
        lVar33 = 0;
        do {
          (&bufferCreateInfo.sType)[lVar33] = 0x3c23d70a;
          lVar33 = lVar33 + 1;
        } while (lVar33 != 4);
        bVar15 = tcu::floatThresholdCompare
                           (log,"Image Comparison",comparisonName._M_dataplus._M_p,
                            (ConstPixelBufferAccess *)&regions,(ConstPixelBufferAccess *)&renderPass
                            ,(Vec4 *)&bufferCreateInfo,COMPARE_LOG_RESULT);
      }
      else {
        lVar33 = 0;
        do {
          (&bufferCreateInfo.sType)[lVar33] = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
          lVar33 = lVar33 + 1;
        } while (lVar33 != 4);
        bVar15 = tcu::intThresholdCompare
                           (log,"Image Comparison",comparisonName._M_dataplus._M_p,
                            (ConstPixelBufferAccess *)&regions,(ConstPixelBufferAccess *)&renderPass
                            ,(UVec4 *)&bufferCreateInfo,COMPARE_LOG_RESULT);
      }
      local_590 = local_590 +
                  mipLevelStorageSizes.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar22];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)comparisonName._M_dataplus._M_p != &comparisonName.field_2) {
        operator_delete(comparisonName._M_dataplus._M_p,
                        comparisonName.field_2._M_allocated_capacity + 1);
      }
      bVar29 = bVar29 & bVar15;
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&vertices);
      uVar22 = uVar22 + 1;
    } while (uVar22 != (uVar17 & 0x7fffffff));
  }
  if (bVar29 == 0) {
    bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"Fail","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,bufferCreateInfo._0_8_,
               (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
  }
  else {
    bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,bufferCreateInfo._0_8_,
               (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
  }
  if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
    operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
  }
  if (uVar10 != 0) {
    (**(code **)(*(long *)uVar10 + 8))();
  }
  if (vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  if (local_508 != (long *)0x0) {
    (**(code **)(*local_508 + 8))();
  }
  if (depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  if (uVar12 != 0) {
    (**(code **)(*(long *)uVar12 + 8))();
  }
  if (colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  if (local_98.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_90,local_98);
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_70,local_78);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_50,local_58);
  }
  if (uVar11 != 0) {
    (**(code **)(*(long *)uVar11 + 8))();
  }
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_130,(VkBuffer)obj.m_internal);
  }
  if (mipLevelStorageSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(mipLevelStorageSizes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)mipLevelStorageSizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)mipLevelStorageSizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (mipLevelSizes.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(mipLevelSizes.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)mipLevelSizes.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)mipLevelSizes.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testRenderToMipMaps (Context& context, const CaseDef caseDef)
{
	checkImageViewTypeRequirements(context, caseDef.viewType);

	const DeviceInterface&			vk					= context.getDeviceInterface();
	const InstanceInterface&		vki					= context.getInstanceInterface();
	const VkDevice					device				= context.getDevice();
	const VkPhysicalDevice			physDevice			= context.getPhysicalDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	const IVec4						imageSize				= caseDef.imageSizeHint;	// MAX_SIZE is not used in this test
	const deInt32					numSlices				= maxLayersOrDepth(imageSize);
	const vector<IVec4>				mipLevelSizes			= getMipLevelSizes(imageSize);
	const vector<VkDeviceSize>		mipLevelStorageSizes	= getPerMipLevelStorageSize(mipLevelSizes, tcu::getPixelSize(mapVkFormat(caseDef.colorFormat)));
	const int						numMipLevels			= static_cast<int>(mipLevelSizes.size());
	const bool						useDepthStencil			= (caseDef.depthStencilFormat != VK_FORMAT_UNDEFINED);

	if (useDepthStencil && !isDepthStencilFormatSupported(vki, physDevice, caseDef.depthStencilFormat))
		TCU_THROW(NotSupportedError, "Unsupported depth/stencil format");

	// Create a color buffer big enough to hold all layers and mip levels
	const VkDeviceSize				colorBufferSize		= sum(mipLevelStorageSizes);
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	{
		deMemset(colorBufferAlloc->getHostPtr(), 0, static_cast<std::size_t>(colorBufferSize));
		flushMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
	}

	const Unique<VkShaderModule>	vertexModule		(createShaderModule	(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	fragmentModule		(createShaderModule	(vk, device, context.getBinaryCollection().get("frag"), 0u));
	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout	(vk, device));

	Move<VkImage>					colorImage;
	MovePtr<Allocation>				colorImageAlloc;
	Move<VkImage>					depthStencilImage;
	MovePtr<Allocation>				depthStencilImageAlloc;
	Move<VkBuffer>					vertexBuffer;
	MovePtr<Allocation>				vertexBufferAlloc;

	// Create a color image
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

		colorImage		= makeImage(vk, device, getImageCreateFlags(caseDef.viewType), getImageType(caseDef.viewType), caseDef.colorFormat,
									imageSize.swizzle(0, 1, 2), numMipLevels, imageSize.w(), imageUsage);
		colorImageAlloc	= bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any);
	}

	// Create a depth/stencil image (always a 2D image, optionally layered)
	if (useDepthStencil)
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;

		depthStencilImage		= makeImage(vk, device, (VkImageCreateFlags)0, VK_IMAGE_TYPE_2D, caseDef.depthStencilFormat,
											IVec3(imageSize.x(), imageSize.y(), 1), numMipLevels, numSlices, imageUsage);
		depthStencilImageAlloc	= bindImage(vk, device, allocator, *depthStencilImage, MemoryRequirement::Any);
	}

	// Create a vertex buffer
	{
		const vector<Vertex4RGBA>	vertices			= genFullQuadVertices(numSlices);
		const VkDeviceSize			vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);
		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// Prepare images
	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);

		const VkImageMemoryBarrier	imageBarriers[]	=
		{
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType            sType;
				DE_NULL,											// const void*                pNext;
				(VkAccessFlags)0,									// VkAccessFlags              srcAccessMask;
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags              dstAccessMask;
				VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout              oldLayout;
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout              newLayout;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   dstQueueFamilyIndex;
				*colorImage,										// VkImage                    image;
				{													// VkImageSubresourceRange    subresourceRange;
					VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags    aspectMask;
					0u,													// uint32_t              baseMipLevel;
					static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
					0u,													// uint32_t              baseArrayLayer;
					static_cast<deUint32>(imageSize.w()),				// uint32_t              layerCount;
				},
			},
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType            sType;
				DE_NULL,											// const void*                pNext;
				(VkAccessFlags)0,									// VkAccessFlags              srcAccessMask;
				VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags              dstAccessMask;
				VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout              oldLayout;
				VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout              newLayout;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,							// uint32_t                   dstQueueFamilyIndex;
				*depthStencilImage,									// VkImage                    image;
				{													// VkImageSubresourceRange    subresourceRange;
					getFormatAspectFlags(caseDef.depthStencilFormat),	// VkImageAspectFlags    aspectMask;
					0u,													// uint32_t              baseMipLevel;
					static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
					0u,													// uint32_t              baseArrayLayer;
					static_cast<deUint32>(numSlices),					// uint32_t              layerCount;
				},
			}
		};

		const deUint32	numImageBarriers = static_cast<deUint32>(DE_LENGTH_OF_ARRAY(imageBarriers) - (useDepthStencil ? 0 : 1));

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
								0u, DE_NULL, 0u, DE_NULL, numImageBarriers, imageBarriers);

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Draw
	for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
	{
		const IVec4&	mipSize		= mipLevelSizes[mipLevel];
		const int		levelSlices	= maxLayersOrDepth(mipSize);

		drawToMipLevel (context, caseDef, mipLevel, mipSize, levelSlices, *colorImage, *depthStencilImage, *vertexBuffer, *pipelineLayout,
						*vertexModule, *fragmentModule);
	}

	// Copy results: colorImage -> host visible colorBuffer
	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);

		{
			const VkImageMemoryBarrier	imageBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType            sType;
					DE_NULL,										// const void*                pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags              srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags              dstAccessMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout              oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,			// VkImageLayout              newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t                   srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t                   dstQueueFamilyIndex;
					*colorImage,									// VkImage                    image;
					{												// VkImageSubresourceRange    subresourceRange;
						VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags    aspectMask;
						0u,													// uint32_t              baseMipLevel;
						static_cast<deUint32>(numMipLevels),				// uint32_t              levelCount;
						0u,													// uint32_t              baseArrayLayer;
						static_cast<deUint32>(imageSize.w()),				// uint32_t              layerCount;
					},
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
									0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(imageBarriers), imageBarriers);
		}
		{
			vector<VkBufferImageCopy>	regions;
			VkDeviceSize				levelOffset = 0ull;
			VkBufferImageCopy			workRegion	=
			{
				0ull,																				// VkDeviceSize                bufferOffset;
				0u,																					// uint32_t                    bufferRowLength;
				0u,																					// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, imageSize.w()),		// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),																// VkOffset3D                  imageOffset;
				makeExtent3D(0, 0, 0),																// VkExtent3D                  imageExtent;
			};

			for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
			{
				workRegion.bufferOffset					= levelOffset;
				workRegion.imageSubresource.mipLevel	= static_cast<deUint32>(mipLevel);
				workRegion.imageExtent					= makeExtent3D(mipLevelSizes[mipLevel].swizzle(0, 1, 2));

				regions.push_back(workRegion);

				levelOffset += mipLevelStorageSizes[mipLevel];
			}

			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, static_cast<deUint32>(regions.size()), &regions[0]);
		}
		{
			const VkBufferMemoryBarrier	bufferBarriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
									0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify results (per mip level)
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);

		const tcu::TextureFormat			format			= mapVkFormat(caseDef.colorFormat);

		VkDeviceSize						levelOffset		= 0ull;
		bool								allOk			= true;

		for (int mipLevel = 0; mipLevel < numMipLevels; ++mipLevel)
		{
			const IVec4&						mipSize			= mipLevelSizes[mipLevel];
			const void*	const					pLevelData		= static_cast<const deUint8*>(colorBufferAlloc->getHostPtr()) + levelOffset;
			const int							levelDepth		= maxLayersOrDepth(mipSize);
			const tcu::ConstPixelBufferAccess	resultImage		(format, mipSize.x(), mipSize.y(), levelDepth, pLevelData);
			tcu::TextureLevel					textureLevel	(format, mipSize.x(), mipSize.y(), levelDepth);
			const tcu::PixelBufferAccess		expectedImage	= textureLevel.getAccess();
			const std::string					comparisonName	= "Mip level " + de::toString(mipLevel);
			bool								ok				= false;

			generateExpectedImage(expectedImage, mipSize.swizzle(0, 1), 0);

			if (isFloatFormat(caseDef.colorFormat))
				ok = tcu::floatThresholdCompare(context.getTestContext().getLog(), "Image Comparison", comparisonName.c_str(), expectedImage, resultImage, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);
			else
				ok = tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", comparisonName.c_str(), expectedImage, resultImage, tcu::UVec4(2), tcu::COMPARE_LOG_RESULT);

			allOk		=  allOk && ok;	// keep testing all levels, even if we know it's a fail overall
			levelOffset += mipLevelStorageSizes[mipLevel];
		}

		return allOk ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Fail");
	}
}